

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprofiletocsv.cpp
# Opt level: O1

void fmprofiletocsv::dostep(bool skipheader)

{
  size_t sVar1;
  undefined7 in_register_00000039;
  undefined8 in_R8;
  undefined8 in_R9;
  fm_profile_step q;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    printf("profile_id,calcrule_id,deductible1,deductible2,");
    printf("deductible3,attachment1,limit1,share1,share2,");
    printf("share3,step_id,calcrule_id,trigger_start,trigger_end,");
    printf("payout_start,payout_end,limit2,scale1,");
    puts("scale2");
  }
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_28 = 0;
  sVar1 = fread(&local_68,0x48,1,_stdin);
  if (sVar1 != 0) {
    do {
      printf("%d,%d,%f,%f,%f,%f,%f,%f,%f,%f,%d,%f,%f,%f,%f,%f,%f,%f\n",
             SUB84((double)(float)uStack_60,0),(double)uStack_60._4_4_,(double)(float)local_58,
             (double)local_58._4_4_,(double)(float)uStack_50,(double)uStack_50._4_4_,
             (double)(float)local_48,(double)local_48._4_4_,local_68 & 0xffffffff,local_68 >> 0x20,
             uStack_40 & 0xffffffff,in_R8,in_R9,(double)uStack_40._4_4_,(double)(float)local_38,
             (double)local_38._4_4_,(double)(float)uStack_30,(double)uStack_30._4_4_,
             (double)(float)local_28,(double)local_28._4_4_);
      sVar1 = fread(&local_68,0x48,1,_stdin);
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

void dostep(bool skipheader) {
		if (skipheader == false) {
            printf("profile_id,calcrule_id,deductible1,deductible2,");
            printf("deductible3,attachment1,limit1,share1,share2,");
            printf("share3,step_id,calcrule_id,trigger_start,trigger_end,");
			printf("payout_start,payout_end,limit2,scale1,");
			printf("scale2\n");
		}

		fm_profile_step q;
		size_t i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf("%d,%d,%f,%f,%f,%f,%f,%f,%f,%f,%d,%f,%f,%f,%f,%f,%f,%f\n", q.profile_id,
                q.calcrule_id, q.deductible1, q.deductible2, q.deductible3,
                q.attachment, q.limit1, q.share1, q.share2, q.share3,q.step_id,
				q.trigger_start, q.trigger_end, q.payout_start,
				q.payout_end, q.limit2, q.scale1, q.scale2);

			i = fread(&q, sizeof(q), 1, stdin);
		}
	}